

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hal_jpege_vepu2_v2.c
# Opt level: O3

MPP_RET hal_jpege_vepu2_part_start(void *hal,HalEncTask *task)

{
  RK_U32 RVar1;
  uint uVar2;
  RK_U32 start_mbrow;
  undefined4 uVar3;
  JpegeSyntax *syntax;
  int iVar4;
  MPP_RET MVar5;
  MPP_RET MVar6;
  char *fmt;
  RK_U32 RVar7;
  long lVar8;
  bool bVar9;
  MppDevRegRdCfg rd_cfg;
  MppDevRegWrCfg wr_cfg;
  uint local_60;
  undefined8 local_50;
  undefined4 local_48;
  undefined4 local_44;
  undefined8 local_40;
  undefined4 local_38;
  undefined4 local_34;
  
  syntax = (JpegeSyntax *)(task->syntax).data;
  RVar1 = syntax->mcu_hor_cnt;
  uVar2 = syntax->mcu_ver_cnt;
  start_mbrow = *(RK_U32 *)((long)hal + 0x104);
  RVar7 = syntax->part_rows;
  lVar8 = (ulong)(uint)(*(int *)((long)hal + 0x28) * (task->flags).reg_idx) +
          *(long *)((long)hal + 0x18);
  if (((byte)hal_jpege_debug & 1) != 0) {
    _mpp_log_l(4,"hal_jpege_vepu2","enter part start %p\n","hal_jpege_vepu2_part_start",hal);
  }
  task->part_first = (uint)(start_mbrow == 0);
  bVar9 = uVar2 <= start_mbrow + RVar7;
  if (bVar9) {
    RVar7 = syntax->height + start_mbrow * -0x10 + 0xf >> 4;
    local_60 = *(uint *)((long)hal + 0x124);
  }
  else {
    local_60 = 0;
  }
  task->part_last = (uint)bVar9;
  if (((byte)hal_jpege_debug & 4) != 0) {
    _mpp_log_l(4,"hal_jpege_vepu2","part first %d last %d\n",(char *)0x0);
  }
  get_msb_lsb_at_pos((RK_U32 *)(lVar8 + 0xcc),(RK_U32 *)(lVar8 + 0xd0),
                     *(RK_U8 **)((long)hal + 0x108),*(RK_U32 *)((long)hal + 0x11c));
  *(int *)(lVar8 + 0xd4) = *(int *)((long)hal + 0x110) - *(int *)((long)hal + 0x11c);
  *(uint *)(lVar8 + 0xf0) =
       *(int *)((long)hal + 0x120) << 4 | local_60 | (*(uint *)((long)hal + 0x11c) & 7) << 0x13;
  iVar4 = mpp_buffer_get_fd_with_caller(task->output,"hal_jpege_vepu2_part_start");
  *(int *)(lVar8 + 0x134) = iVar4;
  if (*(RK_U32 *)((long)hal + 0x11c) != 0) {
    mpp_dev_set_reg_offset(*hal,0x4d,*(RK_U32 *)((long)hal + 0x11c));
  }
  *(RK_U32 *)(lVar8 + 0x19c) = RVar7 << 0x14 | RVar1 << 8 | 0x61;
  if (((byte)hal_jpege_debug & 4) != 0) {
    _mpp_log_l(4,"hal_jpege_vepu2","part_not_end 0x%x, rst_marker_idx %d",(char *)0x0,
               (ulong)(uint)!bVar9,(ulong)*(uint *)((long)hal + 0x128));
  }
  *(uint *)(lVar8 + 0x1ac) =
       (uint)jpege_restart_marker[*(uint *)((long)hal + 0x128) & 7] | (uint)!bVar9 << 0x18;
  *(int *)((long)hal + 0x128) = *(int *)((long)hal + 0x128) + 1;
  hal_jpege_vepu2_set_extra_info(*hal,syntax,start_mbrow);
  *(int *)((long)hal + 0x104) = *(int *)((long)hal + 0x104) + RVar7;
  uVar3 = *(undefined4 *)((long)hal + 0x28);
  local_40 = *(undefined8 *)((long)hal + 0x18);
  local_34 = 0;
  local_38 = uVar3;
  MVar5 = mpp_dev_ioctl(*hal,4,&local_40);
  if (MVar5 == MPP_OK) {
    local_50 = *(undefined8 *)((long)hal + 0x20);
    local_44 = 0;
    local_48 = uVar3;
    MVar5 = mpp_dev_ioctl(*hal,5,&local_50);
    if (MVar5 == MPP_OK) {
      MVar6 = mpp_dev_ioctl(*hal,0xf,(void *)0x0);
      MVar5 = MPP_OK;
      if (MVar6 != MPP_OK) {
        _mpp_log_l(2,"hal_jpege_vepu2","send cmd failed %d\n","hal_jpege_vepu2_part_start",
                   (ulong)(uint)MVar6);
        MVar5 = MVar6;
      }
      goto LAB_0024a8ff;
    }
    fmt = "set register read failed %d\n";
  }
  else {
    fmt = "set register write failed %d\n";
  }
  _mpp_log_l(2,"hal_jpege_vepu2",fmt,"hal_jpege_vepu2_part_start",(ulong)(uint)MVar5);
LAB_0024a8ff:
  if (((byte)hal_jpege_debug & 1) != 0) {
    _mpp_log_l(4,"hal_jpege_vepu2","leave part start %p\n","hal_jpege_vepu2_part_start",hal);
  }
  return MVar5;
}

Assistant:

MPP_RET hal_jpege_vepu2_part_start(void *hal, HalEncTask *task)
{
    MPP_RET ret = MPP_OK;
    HalJpegeCtx *ctx = (HalJpegeCtx *)hal;
    JpegeSyntax *syntax = (JpegeSyntax *)task->syntax.data;
    RK_U32 mcu_w = syntax->mcu_hor_cnt;
    RK_U32 mcu_h = syntax->mcu_ver_cnt;
    RK_U32 mcu_y = ctx->mcu_y;
    RK_U32 part_mcu_h = syntax->part_rows;
    RK_S32 reg_idx = task->flags.reg_idx;
    RK_U32 *regs = (RK_U32 *)((RK_U8 *)ctx->regs + ctx->reg_size * reg_idx);
    RK_U32 part_enc_h;
    RK_U32 part_enc_mcu_h;
    RK_U32 part_y_fill;
    RK_U32 part_not_end;

    hal_jpege_dbg_func("enter part start %p\n", hal);

    /* Fix register for each part encoding */
    task->part_first = !mcu_y;
    if (mcu_y + part_mcu_h < mcu_h) {
        part_enc_h = part_mcu_h * 16;
        part_enc_mcu_h = part_mcu_h;
        part_y_fill = 0;
        part_not_end = 1;
        task->part_last = 0;
    } else {
        part_enc_h = syntax->height - mcu_y * 16;
        part_enc_mcu_h = MPP_ALIGN(part_enc_h, 16) / 16;;
        part_y_fill = ctx->part_y_fill;
        part_not_end = 0;
        task->part_last = 1;
    }

    hal_jpege_dbg_detail("part first %d last %d\n", task->part_first, task->part_last);

    get_msb_lsb_at_pos(&regs[51], &regs[52], ctx->base, ctx->part_bytepos);

    regs[53] = ctx->size - ctx->part_bytepos;

    regs[60] = (((ctx->part_bytepos & 7) * 8) << 16) |
               (ctx->part_x_fill << 4) |
               (part_y_fill);

    regs[77] = mpp_buffer_get_fd(task->output);
    if (ctx->part_bytepos)
        mpp_dev_set_reg_offset(ctx->dev, 77, ctx->part_bytepos);

    regs[103] = mcu_w << 8  |
                (part_enc_mcu_h) << 20 |
                (1 << 6) |  /* intra coding  */
                (2 << 4) |  /* format jpeg   */
                1;          /* encoder start */

    hal_jpege_dbg_detail("part_not_end 0x%x, rst_marker_idx %d",
                         part_not_end, ctx->rst_marker_idx);
    regs[107] = part_not_end << 24 | jpege_restart_marker[ctx->rst_marker_idx & 7];
    ctx->rst_marker_idx++;

    hal_jpege_vepu2_set_extra_info(ctx->dev, syntax, mcu_y);
    ctx->mcu_y += part_enc_mcu_h;

    do {
        MppDevRegWrCfg wr_cfg;
        MppDevRegRdCfg rd_cfg;
        RK_U32 reg_size = ctx->reg_size;

        wr_cfg.reg = ctx->regs;
        wr_cfg.size = reg_size;
        wr_cfg.offset = 0;

        ret = mpp_dev_ioctl(ctx->dev, MPP_DEV_REG_WR, &wr_cfg);
        if (ret) {
            mpp_err_f("set register write failed %d\n", ret);
            break;
        }

        rd_cfg.reg = ctx->regs_out;
        rd_cfg.size = reg_size;
        rd_cfg.offset = 0;

        ret = mpp_dev_ioctl(ctx->dev, MPP_DEV_REG_RD, &rd_cfg);
        if (ret) {
            mpp_err_f("set register read failed %d\n", ret);
            break;
        }

        ret = mpp_dev_ioctl(ctx->dev, MPP_DEV_CMD_SEND, NULL);
        if (ret) {
            mpp_err_f("send cmd failed %d\n", ret);
            break;
        }
    } while (0);

    hal_jpege_dbg_func("leave part start %p\n", hal);
    (void)task;
    return ret;
}